

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O1

Pubkey * __thiscall
cfd::core::DescriptorNode::GetPubkey
          (Pubkey *__return_storage_ptr__,DescriptorNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *array_argument)

{
  pointer __dest;
  size_t __n;
  DescriptorKeyReference ref;
  DescriptorKeyReference DStack_2a8;
  
  GetKeyReferences(&DStack_2a8,this,array_argument);
  (__return_storage_ptr__->data_).data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->data_).data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->data_).data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_create_storage
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (long)DStack_2a8.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)DStack_2a8.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start);
  __dest = (__return_storage_ptr__->data_).data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)DStack_2a8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)DStack_2a8.pubkey_.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  if (__n != 0) {
    memmove(__dest,DStack_2a8.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,__n);
  }
  (__return_storage_ptr__->data_).data_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __dest + __n;
  DescriptorKeyReference::~DescriptorKeyReference(&DStack_2a8);
  return __return_storage_ptr__;
}

Assistant:

Pubkey DescriptorNode::GetPubkey(
    std::vector<std::string>* array_argument) const {
  DescriptorKeyReference ref = GetKeyReferences(array_argument);
  return ref.GetPubkey();
}